

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O0

void __thiscall DThinker::CallTick(DThinker *this)

{
  uint uVar1;
  PClass *pPVar2;
  VMFunction **ppVVar3;
  VMFrameStack *this_00;
  VMValue *local_68;
  VMFunction *local_60;
  undefined1 local_38 [8];
  VMValue params [1];
  VMFunction *func;
  PClass *clss;
  DThinker *this_local;
  
  if ((CallTick::VIndex == 0xffffffff) &&
     (CallTick::VIndex = GetVirtualIndex(RegistrationInfo.MyClass,"Tick"),
     CallTick::VIndex == 0xffffffff)) {
    __assert_fail("VIndex != ~0u",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                  ,0x22b,"void DThinker::CallTick()");
  }
  pPVar2 = DObject::GetClass(&this->super_DObject);
  uVar1 = TArray<VMFunction_*,_VMFunction_*>::Size(&pPVar2->Virtuals);
  if (CallTick::VIndex < uVar1) {
    ppVVar3 = TArray<VMFunction_*,_VMFunction_*>::operator[]
                        (&pPVar2->Virtuals,(ulong)CallTick::VIndex);
    local_60 = *ppVVar3;
  }
  else {
    local_60 = (VMFunction *)0x0;
  }
  if (local_60 == (VMFunction *)0x0) {
    (*(this->super_DObject)._vptr_DObject[7])();
  }
  else {
    VMValue::VMValue((VMValue *)local_38,&this->super_DObject);
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    VMFrameStack::Call(this_00,local_60,(VMValue *)local_38,1,(VMReturn *)0x0,0,(VMException **)0x0)
    ;
    local_68 = (VMValue *)((long)&params[0].field_0 + 8);
    do {
      local_68 = local_68 + -1;
      VMValue::~VMValue(local_68);
    } while (local_68 != (VMValue *)local_38);
  }
  return;
}

Assistant:

void DThinker::CallTick()
{
	IFVIRTUAL(DThinker, Tick)
	{
		// Without the type cast this picks the 'void *' assignment...
		VMValue params[1] = { (DObject*)this };
		GlobalVMStack.Call(func, params, 1, nullptr, 0, nullptr);
	}
	else Tick();
}